

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
StringInstance::op_length
          (string *__return_storage_ptr__,StringInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  undefined8 *puVar3;
  uint uVar4;
  ulong uVar5;
  string *__str;
  uint __len;
  
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  uVar1 = (uint)(this->_value)._M_string_length;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar4 = (uint)uVar5;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_001478d8;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_001478d8;
      }
      if (uVar4 < 10000) goto LAB_001478d8;
      uVar5 = uVar5 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_001478d8:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct
            ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar1 >> 0x1f),__len,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string StringInstance::op_last(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int n = IntegerInstance(arguments[0]).value();
    if (n < 0)
        throw EXC_INVALID_ARGUMENT;
    n = std::min(n, int(_value.size()));
    return "\"" + str_utils::escape(_value.substr(int(_value.size()) - n), '"') + "\"";
}